

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O2

void xml_node_free(xml_node *node)

{
  xml_attribute *__ptr;
  xml_node **ppxVar1;
  xml_attribute **ppxVar2;
  
  free(node->name);
  free(node->content);
  for (ppxVar2 = node->attributes; __ptr = *ppxVar2, __ptr != (xml_attribute *)0x0;
      ppxVar2 = ppxVar2 + 1) {
    free(__ptr->name);
    free(__ptr->content);
    free(__ptr);
  }
  free(node->attributes);
  for (ppxVar1 = node->children; *ppxVar1 != (xml_node *)0x0; ppxVar1 = ppxVar1 + 1) {
    xml_node_free(*ppxVar1);
  }
  free(node->children);
  free(node);
  return;
}

Assistant:

static void xml_node_free(struct xml_node* node) {
	xml_string_free(node->name);

	if (node->content) {
		xml_string_free(node->content);
	}

	struct xml_attribute** at = node->attributes;
	while(*at) {
		xml_attribute_free(*at);
		++at;
	}
	free(node->attributes);

	struct xml_node** it = node->children;
	while (*it) {
		xml_node_free(*it);
		++it;
	}
	free(node->children);

	free(node);
}